

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O0

void Am_Handle_Event_Received(XEvent *event_return)

{
  bool bVar1;
  uint uVar2;
  Am_Drawonable_Impl *draw_00;
  ostream *poVar3;
  Time TVar4;
  Atom wm_delete_window;
  int bb;
  int rb;
  int tb;
  int lb;
  int outer_top_1;
  int outer_left_1;
  int height;
  int width;
  int top_1;
  int left_1;
  int h;
  int w;
  int y;
  int x;
  int outer_top;
  int outer_left;
  int bottom;
  int right;
  int top;
  int left;
  Am_Input_Char local_58;
  Am_Input_Char local_54;
  Am_Input_Char local_50;
  Am_Input_Char local_4c;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  Am_Input_Event_Handlers *pAStack_20;
  Am_Input_Char ic;
  Am_Input_Event_Handlers *evh;
  Am_Drawonable_Impl *draw;
  XEvent *event_return_local;
  
  draw_00 = Get_Drawable_Backpointer((event_return->xany).display,(event_return->xany).window);
  if (draw_00 == (Am_Drawonable_Impl *)0x0) {
    if (Am_Debug_Print_Input_Events != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"<> Input ignored because no drawonable\n");
      std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    }
  }
  else {
    if (draw_00->ext_handler != (Am_External_Event_Handler *)0x0) {
      (*draw_00->ext_handler)(event_return);
    }
    pAStack_20 = draw_00->event_handlers;
    Am_Input_Char::Am_Input_Char(&local_24,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    if (pAStack_20 == (Am_Input_Event_Handlers *)0x0) {
      if (Am_Debug_Print_Input_Events != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"<> Input ignored for ");
        poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
        poVar3 = std::operator<<(poVar3," because no Event_Handler\n");
        std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
      }
    }
    else {
      switch(event_return->type) {
      case 2:
        local_28 = create_input_char_from_key(&event_return->xkey,draw_00->screen->display);
        Am_Input_Char::operator=(&local_24,&local_28);
        if (local_24.code != 0) {
          local_2c = local_24;
          bVar1 = exit_if_stop_char(local_24);
          if (!bVar1) {
            local_30 = local_24;
            set_input_event(Am_Current_Input_Event,local_24,(event_return->xkey).x,
                            (event_return->xkey).y,(event_return->xkey).time,
                            &draw_00->super_Am_Drawonable);
            (**(code **)(*(long *)draw_00->event_handlers + 0x28))
                      (draw_00->event_handlers,draw_00,Am_Current_Input_Event);
          }
        }
        break;
      case 3:
      case 9:
      case 10:
      case 0xb:
      case 0xf:
      case 0x14:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x20:
      case 0x22:
        poVar3 = std::operator<<((ostream *)&std::cout,"** Received event of unexpected type: ");
        poVar3 = std::operator<<(poVar3,event_names[event_return->type]);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      case 0xd:
      case 0xe:
      case 0x10:
      case 0x1f:
        break;
      case 4:
        local_34 = create_input_char_from_mouse
                             ((event_return->xkey).keycode,(event_return->xkey).state,Am_BUTTON_DOWN
                              ,(event_return->xkey).time,draw_00->screen);
        Am_Input_Char::operator=(&local_24,&local_34);
        local_38 = local_24;
        bVar1 = exit_if_stop_char(local_24);
        if (!bVar1) {
          local_3c = local_24;
          set_input_event(Am_Current_Input_Event,local_24,(event_return->xkey).x,
                          (event_return->xkey).y,(event_return->xkey).time,
                          &draw_00->super_Am_Drawonable);
          (**(code **)(*(long *)draw_00->event_handlers + 0x28))
                    (draw_00->event_handlers,draw_00,Am_Current_Input_Event);
        }
        break;
      case 5:
        local_40 = create_input_char_from_mouse
                             ((event_return->xkey).keycode,(event_return->xkey).state,Am_BUTTON_UP,
                              (event_return->xkey).time,draw_00->screen);
        Am_Input_Char::operator=(&local_24,&local_40);
        local_44 = local_24;
        bVar1 = exit_if_stop_char(local_24);
        if (!bVar1) {
          local_48 = local_24;
          set_input_event(Am_Current_Input_Event,local_24,(event_return->xkey).x,
                          (event_return->xkey).y,(event_return->xkey).time,
                          &draw_00->super_Am_Drawonable);
          (**(code **)(*(long *)draw_00->event_handlers + 0x28))
                    (draw_00->event_handlers,draw_00,Am_Current_Input_Event);
        }
        break;
      case 6:
        local_4c = create_input_char_from_code
                             (0x103,(event_return->xkey).state,Am_NEITHER,Am_SINGLE_CLICK);
        Am_Input_Char::operator=(&local_24,&local_4c);
        local_50 = local_24;
        set_input_event(Am_Current_Input_Event,local_24,(event_return->xkey).x,
                        (event_return->xkey).y,(event_return->xkey).time,
                        &draw_00->super_Am_Drawonable);
        (**(code **)(*(long *)draw_00->event_handlers + 0x28))
                  (draw_00->event_handlers,draw_00,Am_Current_Input_Event);
        break;
      case 7:
        local_54 = create_input_char_from_code
                             (0x104,(event_return->xcrossing).state,Am_NEITHER,Am_SINGLE_CLICK);
        Am_Input_Char::operator=(&local_24,&local_54);
        local_58 = local_24;
        set_input_event(Am_Current_Input_Event,local_24,(event_return->xkey).x,
                        (event_return->xkey).y,(event_return->xkey).time,
                        &draw_00->super_Am_Drawonable);
        (**(code **)(*(long *)draw_00->event_handlers + 0x28))
                  (draw_00->event_handlers,draw_00,Am_Current_Input_Event);
        break;
      case 8:
        left = (int)create_input_char_from_code
                              (0x105,(event_return->xcrossing).state,Am_NEITHER,Am_SINGLE_CLICK);
        Am_Input_Char::operator=(&local_24,(Am_Input_Char *)&left);
        top = (int)local_24;
        set_input_event(Am_Current_Input_Event,local_24,(event_return->xkey).x,
                        (event_return->xkey).y,(event_return->xkey).time,
                        &draw_00->super_Am_Drawonable);
        (**(code **)(*(long *)draw_00->event_handlers + 0x28))
                  (draw_00->event_handlers,draw_00,Am_Current_Input_Event);
        break;
      case 0xc:
        if (Am_Debug_Print_Input_Events != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"<> Exposure Event, x=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(event_return->xfocus).mode);
          poVar3 = std::operator<<(poVar3," y=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(event_return->xfocus).detail);
          poVar3 = std::operator<<(poVar3," width=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(event_return->xexpose).width);
          poVar3 = std::operator<<(poVar3," height=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(event_return->xexpose).height);
          poVar3 = std::operator<<(poVar3," drawonable=");
          poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        (**(code **)(*(long *)draw_00->event_handlers + 0x20))
                  (draw_00->event_handlers,draw_00,(event_return->xfocus).mode,
                   (event_return->xfocus).detail,(event_return->xexpose).width,
                   (event_return->xexpose).height);
        break;
      case 0x11:
        if (Am_Debug_Print_Input_Events != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"<> DestroyNotify, drawonable=");
          poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        (**(code **)(*(long *)draw_00->event_handlers + 0x10))(draw_00->event_handlers,draw_00);
        break;
      case 0x12:
        if (Am_Debug_Print_Input_Events != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"<> UnmapNotify, drawonable=");
          poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        if ((draw_00->expect_map_change & 1U) == 0) {
          Am_Drawonable_Impl::iconify_notify(draw_00,true);
          (*(code *)**(undefined8 **)draw_00->event_handlers)(draw_00->event_handlers,draw_00,1);
        }
        else {
          draw_00->expect_map_change = false;
        }
        break;
      case 0x13:
        if (Am_Debug_Print_Input_Events != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"<> MapNotify, drawonable=");
          poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        if ((draw_00->expect_map_change & 1U) == 0) {
          Am_Drawonable_Impl::iconify_notify(draw_00,false);
          (*(code *)**(undefined8 **)draw_00->event_handlers)(draw_00->event_handlers,draw_00,0);
        }
        else {
          draw_00->expect_map_change = false;
        }
        break;
      case 0x15:
        if (Am_Debug_Print_Input_Events != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"<> ReparentNotify, drawonable=");
          poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        (*(draw_00->super_Am_Drawonable)._vptr_Am_Drawonable[4])
                  (draw_00,&right,&bottom,&outer_left,&outer_top,&x,&y);
        (**(code **)(*(long *)draw_00->event_handlers + 8))
                  (draw_00->event_handlers,draw_00,right,bottom,outer_left,outer_top);
        break;
      case 0x16:
        uVar2 = (*(draw_00->super_Am_Drawonable)._vptr_Am_Drawonable[4])
                          (draw_00,&rb,&bb,(long)&wm_delete_window + 4,&wm_delete_window,&lb,&tb);
        if ((uVar2 & 1) != 0) {
          w = lb;
          h = tb;
          left_1 = (event_return->xexpose).count;
          top_1 = (event_return->xgraphicsexpose).major_code;
          Am_Drawonable::Get_Position(&draw_00->super_Am_Drawonable,&width,&height);
          Am_Drawonable::Get_Size(&draw_00->super_Am_Drawonable,&outer_left_1,&outer_top_1);
          if ((((w != width) || (h != height)) || (left_1 != outer_left_1)) ||
             (top_1 != outer_top_1)) {
            if (Am_Debug_Print_Input_Events != 0) {
              poVar3 = std::operator<<((ostream *)&std::cout,"<> Configure Notify, x=");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,w);
              poVar3 = std::operator<<(poVar3," y=");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,h);
              poVar3 = std::operator<<(poVar3," width=");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,outer_left_1);
              poVar3 = std::operator<<(poVar3," height=");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,outer_top_1);
              poVar3 = std::operator<<(poVar3," drawonable=");
              poVar3 = operator<<(poVar3,&draw_00->super_Am_Drawonable);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
            Am_Drawonable_Impl::reconfigure(draw_00,w,h,left_1,top_1);
            (**(code **)(*(long *)draw_00->event_handlers + 0x18))
                      (draw_00->event_handlers,draw_00,w,h,left_1,top_1);
          }
        }
        break;
      case 0x1d:
        break;
      case 0x1e:
        handle_selection_request(event_return,draw_00);
        break;
      case 0x21:
        TVar4 = XInternAtom((event_return->xany).display,"WM_DELETE_WINDOW",0);
        if ((event_return->xkey).time == TVar4) {
          (**(code **)(*(long *)draw_00->event_handlers + 0x10))(draw_00->event_handlers,draw_00);
        }
      }
    }
  }
  return;
}

Assistant:

void
Am_Handle_Event_Received(XEvent &event_return)
{
  Am_Drawonable_Impl *draw = Get_Drawable_Backpointer(event_return.xany.display,
                                                      event_return.xany.window);
  if (!draw) {
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> Input ignored because no drawonable\n" << std::flush;
    return;
  }
  if (draw->ext_handler) {
    //call the external handler IN ADDITION to local handlers
    draw->ext_handler(&event_return);
  }

  Am_Input_Event_Handlers *evh = draw->event_handlers;
  Am_Input_Char ic;

  if (!evh) {
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> Input ignored for " << draw
                << " because no Event_Handler\n"
                << std::flush;
    return;
  }

  switch (event_return.xany.type) {
  case KeyPress:
    //ic = create_input_char_from_key (event_return.xkey.keycode,
    //				 event_return.xkey.state,
    //				 draw->screen->display);
    ic = create_input_char_from_key(event_return.xkey, draw->screen->display);
    if (ic.code != 0) { // then is a legal code
      if (exit_if_stop_char(ic))
        return;
      set_input_event(Am_Current_Input_Event, ic, event_return.xkey.x,
                      event_return.xkey.y, event_return.xkey.time, draw);
      draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    }
    break;
  case ButtonPress:
    ic = create_input_char_from_mouse(
        event_return.xbutton.button, event_return.xbutton.state, Am_BUTTON_DOWN,
        event_return.xbutton.time, draw->screen);
    if (exit_if_stop_char(ic))
      return;
    set_input_event(Am_Current_Input_Event, ic, event_return.xbutton.x,
                    event_return.xbutton.y, event_return.xbutton.time, draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case ButtonRelease:
    ic = create_input_char_from_mouse(event_return.xbutton.button,
                                      event_return.xbutton.state, Am_BUTTON_UP,
                                      event_return.xbutton.time, draw->screen);
    if (exit_if_stop_char(ic))
      return;
    set_input_event(Am_Current_Input_Event, ic, event_return.xbutton.x,
                    event_return.xbutton.y, event_return.xbutton.time, draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case MotionNotify:
    ic = create_input_char_from_code(Am_MOUSE_MOVED, event_return.xmotion.state,
                                     Am_NEITHER, Am_SINGLE_CLICK);
    set_input_event(Am_Current_Input_Event, ic, event_return.xmotion.x,
                    event_return.xmotion.y, event_return.xmotion.time, draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case EnterNotify:
    ic = create_input_char_from_code(Am_MOUSE_ENTER_WINDOW,
                                     event_return.xcrossing.state, Am_NEITHER,
                                     Am_SINGLE_CLICK);
    set_input_event(Am_Current_Input_Event, ic, event_return.xcrossing.x,
                    event_return.xcrossing.y, event_return.xcrossing.time,
                    draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case LeaveNotify:
    ic = create_input_char_from_code(Am_MOUSE_LEAVE_WINDOW,
                                     event_return.xcrossing.state, Am_NEITHER,
                                     Am_SINGLE_CLICK);
    set_input_event(Am_Current_Input_Event, ic, event_return.xcrossing.x,
                    event_return.xcrossing.y, event_return.xcrossing.time,
                    draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case Expose:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> Exposure Event, x=" << event_return.xexpose.x
                << " y=" << event_return.xexpose.y
                << " width=" << event_return.xexpose.width
                << " height=" << event_return.xexpose.height
                << " drawonable=" << draw << std::endl;
    draw->event_handlers->Exposure_Notify(
        draw,
        //					      event_return.xexpose.count,
        event_return.xexpose.x, event_return.xexpose.y,
        event_return.xexpose.width, event_return.xexpose.height);
    break;
  case DestroyNotify:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> DestroyNotify, drawonable=" << draw << std::endl;
    draw->event_handlers->Destroy_Notify(draw);
    break;
  //// BUG: Not used
  // cases UnmapNotify and MapNotify were commented out
  // EAB: there does not appear to be a way to distinguish internally-generated
  // map/unmap requests from user-generated iconify/deiconify requests
  case UnmapNotify:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> UnmapNotify, drawonable=" << draw << std::endl;
    //	draw->event_handlers->Unmap_Notify(draw);
    if (draw->expect_map_change) {
      draw->expect_map_change = false;
    } else {
      draw->iconify_notify(true);
      draw->event_handlers->Iconify_Notify(draw, true);
    }
    break;
  case MapNotify:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> MapNotify, drawonable=" << draw << std::endl;
    //	  draw->event_handlers->Map_Notify(draw, false);
    if (draw->expect_map_change) {
      draw->expect_map_change = false;
    } else {
      draw->iconify_notify(false);
      draw->event_handlers->Iconify_Notify(draw, false);
    }
    break;
  case ReparentNotify: {
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> ReparentNotify, drawonable=" << draw << std::endl;
    int left, top, right, bottom, outer_left, outer_top;
    draw->Inquire_Window_Borders(left, top, right, bottom, outer_left,
                                 outer_top);
    draw->event_handlers->Frame_Resize_Notify(draw, left, top, right, bottom);
    break;
  }
  case ConfigureNotify: {
    // Configure events may come in for windows that haven't really
    // changed size or position, and in this case the events are ignored
    // (i.e., Gem does not pass them on to the user's event-handler).
    // For example, a 'valid' configure event may be perceived and
    // dispatched that causes the user's ConfigureNotify Event Handler
    // to set the size of the window, which in turn generates a 'bogus'
    // configure event.  When the bogus event is perceived here, we
    // detect it by noticing that its values are equal to those already
    // installed in the drawonable, and throw it away.
    //
    // A Good ConfigureNotify handler should respond to the event
    // not by moving the window again, but by just setting its internal
    // state to correspond to where the window was moved to.  The window
    // manager doesn't have to put the window where you request, or make
    // it the correct size.  It tells you where it put it through a
    // ConfigureNotify event.  If you try to force the WM to put it
    // where you want by looking at the configureNotify event to find
    // out where it actually put it, you might get walking windows
    // no matter what you do.
    //
    // Note: Gem specifications dictate that the "left" and "top" of a
    // window is the left and top of its frame (not necessarily its
    // drawable area).  The "width" and "height" of a window is the
    // width and height of its drawable area.
    // Also, things drawn inside the window have their coordinates
    // relative to the drawable area's left and top.
    //
    int x, y, w, h, left, top, width, height, outer_left, outer_top, lb, tb, rb,
        bb;

    // We need to use inquire_window_borders to calculate the correct
    // x and y values, because X windows returns local coordinates
    // in the event, not global coordinates, so they're always (0,0).

    if (draw->Inquire_Window_Borders(lb, tb, rb, bb, outer_left, outer_top)) {
      x = outer_left;
      y = outer_top;
      w = event_return.xconfigure.width;
      h = event_return.xconfigure.height;
      draw->Get_Position(left, top);
      draw->Get_Size(width, height);
      //	 std::cout << "Configure notify: " << (void*)draw <<  " " << w << " " << h << " " << event_return.xany.window <<std::endl;

      // Only generate a Gem configure-notify event if something changed
      if ((x != left) || (y != top) || (w != width) || (h != height)) {
        if (Am_Debug_Print_Input_Events)
          std::cout << "<> Configure Notify, x=" << x << " y=" << y
                    << " width=" << width << " height=" << height
                    << " drawonable=" << draw << std::endl;
        draw->reconfigure(x, y, w, h);
        draw->event_handlers->Configure_Notify(draw, x, y, w, h);
      }
    }
    break;
  }
  case ClientMessage:
    // this is where we get window destroy messages
    // from the window manager.
    {
      // this is speed-inefficient, but it never happens, so who cares.
      Atom wm_delete_window =
          XInternAtom(event_return.xclient.display, "WM_DELETE_WINDOW", False);
      if ((unsigned long)event_return.xclient.data.l[0] != wm_delete_window)
        break;
      // not a delete window client message.
      draw->event_handlers->Destroy_Notify(draw);
    }
    break;
  case SelectionClear:
    // We get this event when we're forced to release our selection.
    // We'll ignore it for now.
    break;
  case SelectionRequest:
    handle_selection_request(event_return, draw);
    break;
  // next all the events we don't expect to occur
  case KeyRelease:
  case FocusIn:
  case FocusOut:
  case KeymapNotify:
  case VisibilityNotify:
  case MapRequest:
  case ConfigureRequest:
  case GravityNotify:
  case ResizeRequest:
  case CirculateNotify:
  case CirculateRequest:
  case PropertyNotify:
  case ColormapNotify:
  case MappingNotify:
    std::cout << "** Received event of unexpected type: "
              << event_names[event_return.type] << std::endl;
  case CreateNotify:
  case GraphicsExpose:
  case NoExpose:
  case SelectionNotify: // we get this here if get_cut_buffer misses it.

    // we do get these events unfortunately, so silently ignore them.
    break;
  } // end switch
}